

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTable.cpp
# Opt level: O2

void __thiscall glslang::TSymbol::TSymbol(TSymbol *this,TSymbol *copyOf)

{
  TString *pTVar1;
  
  this->_vptr_TSymbol = (_func_int **)&PTR___cxa_pure_virtual_00a5b7e8;
  pTVar1 = NewPoolTString_abi_cxx11_((copyOf->name->_M_dataplus)._M_p);
  this->name = pTVar1;
  pTVar1 = NewPoolTString_abi_cxx11_((copyOf->mangledName->_M_dataplus)._M_p);
  this->mangledName = pTVar1;
  this->uniqueId = copyOf->uniqueId;
  this->writable = true;
  return;
}

Assistant:

TSymbol::TSymbol(const TSymbol& copyOf)
{
    name = NewPoolTString(copyOf.name->c_str());
    mangledName = NewPoolTString(copyOf.mangledName->c_str());
    uniqueId = copyOf.uniqueId;
    writable = true;
}